

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

string * __thiscall
pbrt::AtomicDouble::ToString_abi_cxx11_(string *__return_storage_ptr__,AtomicDouble *this)

{
  __atomic_base<unsigned_long> local_20;
  
  local_20._M_i = (this->bits).super___atomic_base<unsigned_long>._M_i;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<double>(__return_storage_ptr__,"%f",(double *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string AtomicDouble::ToString() const {
    return StringPrintf("%f", double(*this));
}